

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lmi_helper.c
# Opt level: O3

uint64_t helper_packushb_mips64(uint64_t fs,uint64_t ft)

{
  undefined1 auVar1 [12];
  long lVar2;
  ulong uVar3;
  undefined1 auVar4 [16];
  ulong uVar5;
  long lVar6;
  long lVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [12];
  long lVar11;
  undefined1 auVar10 [16];
  undefined1 auVar12 [12];
  undefined1 auVar13 [12];
  undefined1 auVar14 [12];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  short sVar19;
  undefined1 auVar17 [12];
  undefined1 auVar18 [12];
  undefined1 auVar20 [12];
  
  auVar4._8_4_ = (int)fs;
  auVar4._0_8_ = fs;
  auVar4._12_4_ = (int)(fs >> 0x20);
  lVar6 = 0;
  lVar7 = 1;
  lVar2 = 4;
  auVar8 = ZEXT816(0);
  do {
    sVar19 = (short)(auVar4._8_8_ >> (lVar7 << 4));
    auVar17._0_4_ = (int)(short)(fs >> (lVar6 << 4));
    auVar17._4_4_ = (int)sVar19;
    auVar17._8_4_ = (int)sVar19;
    auVar9._0_4_ = -(uint)(0xfe < auVar17._0_4_);
    auVar9._4_4_ = -(uint)(0xfe < auVar17._4_4_);
    auVar9._8_4_ = -(uint)(0 < auVar17._8_4_);
    auVar12._0_4_ = -(uint)(auVar17._0_4_ < 0xff);
    auVar12._4_4_ = -(uint)(auVar17._4_4_ < 0xff);
    auVar12._8_4_ = -(uint)(auVar17._8_4_ < 0);
    auVar13._8_4_ = 0xffffffff;
    auVar13._0_8_ = 0xffffffffffffffff;
    auVar13 = (auVar12 ^ auVar13 | ~auVar9 & auVar17) & SUB1612(ZEXT816(0xff000000ff),0);
    lVar11 = lVar7 << 3;
    auVar10._8_4_ = (undefined4)lVar11;
    auVar10._12_4_ = (undefined4)((ulong)lVar11 >> 0x20);
    auVar10._0_8_ = lVar11;
    auVar15._8_8_ = (ulong)auVar13._4_4_ << auVar10._8_8_;
    auVar15._0_8_ = (auVar13._0_8_ & 0xffffffff) << (lVar6 << 3);
    auVar8 = auVar8 | auVar15;
    lVar6 = lVar6 + 2;
    lVar7 = lVar7 + 2;
    lVar2 = lVar2 + -2;
  } while (lVar2 != 0);
  uVar3 = auVar8._8_8_ | auVar8._0_8_;
  uVar5 = 0;
  auVar8._8_4_ = (int)ft;
  auVar8._0_8_ = ft;
  auVar8._12_4_ = (int)(ft >> 0x20);
  lVar6 = 0;
  lVar7 = 1;
  lVar2 = 4;
  do {
    sVar19 = (short)(auVar8._8_8_ >> (lVar7 << 4));
    auVar20._0_4_ = (int)(short)(ft >> (lVar6 << 4));
    auVar20._4_4_ = (int)sVar19;
    auVar20._8_4_ = (int)sVar19;
    auVar14._0_4_ = -(uint)(0xfe < auVar20._0_4_);
    auVar14._4_4_ = -(uint)(0xfe < auVar20._4_4_);
    auVar14._8_4_ = -(uint)(0 < auVar20._8_4_);
    auVar18._0_4_ = -(uint)(auVar20._0_4_ < 0xff);
    auVar18._4_4_ = -(uint)(auVar20._4_4_ < 0xff);
    auVar18._8_4_ = -(uint)(auVar20._8_4_ < 0);
    auVar1._8_4_ = 0xffffffff;
    auVar1._0_8_ = 0xffffffffffffffff;
    auVar13 = (auVar18 ^ auVar1 | ~auVar14 & auVar20) & SUB1612(ZEXT816(0xff000000ff),0);
    lVar11 = lVar7 * 8 + 0x20;
    auVar16._8_4_ = (undefined4)lVar11;
    auVar16._12_4_ = (undefined4)((ulong)lVar11 >> 0x20);
    auVar16._0_8_ = lVar11;
    uVar3 = uVar3 | (auVar13._0_8_ & 0xffffffff) << lVar6 * 8 + 0x20;
    uVar5 = uVar5 | (ulong)auVar13._4_4_ << auVar16._8_8_;
    lVar6 = lVar6 + 2;
    lVar7 = lVar7 + 2;
    lVar2 = lVar2 + -2;
  } while (lVar2 != 0);
  return uVar5 | uVar3;
}

Assistant:

uint64_t helper_packushb(uint64_t fs, uint64_t ft)
{
    uint64_t fd = 0;
    unsigned int i;

    for (i = 0; i < 4; ++i) {
        int16_t tmp = fs >> (i * 16);
        tmp = SATUB(tmp);
        fd |= (uint64_t)(tmp & 0xff) << (i * 8);
    }
    for (i = 0; i < 4; ++i) {
        int16_t tmp = ft >> (i * 16);
        tmp = SATUB(tmp);
        fd |= (uint64_t)(tmp & 0xff) << (i * 8 + 32);
    }

    return fd;
}